

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

int luaL_callmeta(lua_State *L,int obj,char *event)

{
  int iVar1;
  
  if (0xffffd8ef < obj - 1U) {
    iVar1 = lua_gettop(L);
    obj = obj + iVar1 + 1;
  }
  iVar1 = luaL_getmetafield(L,obj,event);
  if (iVar1 != 0) {
    lua_pushvalue(L,obj);
    lua_call(L,1,1);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

LUALIB_API int luaL_callmeta (lua_State *L, int obj, const char *event) {
  obj = abs_index(L, obj);
  if (!luaL_getmetafield(L, obj, event))  /* no metafield? */
    return 0;
  lua_pushvalue(L, obj);
  lua_call(L, 1, 1);
  return 1;
}